

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

void loop_emit_phi(jit_State *J,IRRef1 *subst,IRRef1 *phi,IRRef nphi,SnapNo onsnap)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  BCReg BVar4;
  BCReg BVar5;
  IRIns *pIVar6;
  SnapEntry *pSVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  IRIns *pIVar12;
  SnapShot *pSVar13;
  ulong uVar14;
  IRRef IVar15;
  int iVar16;
  bool bVar17;
  IRRef rref_1;
  IRIns *ir_3;
  IRRef lref_2;
  IRIns *irr;
  IRIns *ir_2;
  IRRef lref_1;
  IRIns *ir_1;
  IRRef ref_1;
  IRRef ref;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  IRIns *ir;
  SnapNo s;
  IRRef rref;
  IRRef lref;
  IRRef invar;
  IRRef nslots;
  IRRef j;
  IRRef i;
  int passx;
  SnapNo onsnap_local;
  IRRef nphi_local;
  IRRef1 *phi_local;
  IRRef1 *subst_local;
  jit_State *J_local;
  
  bVar8 = false;
  uVar9 = (uint)J->chain[0x11];
  invar = 0;
  for (nslots = 0; nslots < nphi; nslots = nslots + 1) {
    uVar10 = (uint)phi[nslots];
    uVar11 = (uint)subst[uVar10];
    if ((uVar10 == uVar11) || (uVar11 == 0xffff)) {
      pIVar12 = (J->cur).ir;
      *(byte *)((long)pIVar12 + (ulong)uVar10 * 8 + 4) =
           *(byte *)((long)pIVar12 + (ulong)uVar10 * 8 + 4) & 0xbf;
    }
    else {
      IVar15 = invar + 1;
      phi[invar] = phi[nslots];
      invar = IVar15;
      if (((J->cur).ir[uVar11].field_0.op1 != uVar10) &&
         (*(ushort *)((long)(J->cur).ir + (ulong)uVar11 * 8 + 2) != uVar10)) {
        pIVar12 = (J->cur).ir;
        *(byte *)((long)pIVar12 + (ulong)uVar10 * 8 + 4) =
             *(byte *)((long)pIVar12 + (ulong)uVar10 * 8 + 4) | 0x20;
        bVar8 = true;
      }
    }
  }
  passx = invar;
  if (bVar8) {
    nslots = (J->cur).nins;
LAB_0018fe24:
    nslots = nslots - 1;
    if (uVar9 < nslots) {
      pIVar12 = (J->cur).ir + nslots;
      if (0x7fff < (pIVar12->field_0).op2) {
        pIVar6 = (J->cur).ir;
        *(byte *)((long)pIVar6 + (ulong)(pIVar12->field_0).op2 * 8 + 4) =
             *(byte *)((long)pIVar6 + (ulong)(pIVar12->field_0).op2 * 8 + 4) & 0xdf;
      }
      if ((((0x7fff < (pIVar12->field_0).op1) &&
           (pIVar6 = (J->cur).ir,
           *(byte *)((long)pIVar6 + (ulong)(pIVar12->field_0).op1 * 8 + 4) =
                *(byte *)((long)pIVar6 + (ulong)(pIVar12->field_0).op1 * 8 + 4) & 0xdf,
           (pIVar12->field_0).op1 < uVar9)) && (0x5e < (pIVar12->field_1).o)) &&
         ((pIVar12->field_1).o < 0x65)) {
        snap = (SnapShot *)((J->cur).ir + (pIVar12->field_0).op1);
        while (*(char *)((long)&snap->ref + 1) == 'd') {
          if (0x7fff < *(ushort *)((long)&snap->mapofs + 2)) {
            pIVar12 = (J->cur).ir;
            uVar14 = (ulong)*(ushort *)((long)&snap->mapofs + 2);
            *(byte *)((long)pIVar12 + uVar14 * 8 + 4) =
                 *(byte *)((long)pIVar12 + uVar14 * 8 + 4) & 0xdf;
          }
          if ((ushort)snap->mapofs < 0x8000) break;
          snap = (SnapShot *)((J->cur).ir + (ushort)snap->mapofs);
          (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)snap)->t).irt =
               (((anon_struct_8_5_4e98db7e_for_IRIns_2 *)snap)->t).irt & 0xdf;
        }
      }
      goto LAB_0018fe24;
    }
    ir._0_4_ = (uint)(J->cur).nsnap;
    while (ir._0_4_ = (uint)ir - 1, onsnap <= (uint)ir) {
      pSVar13 = (J->cur).snap + (uint)ir;
      pSVar7 = (J->cur).snapmap;
      uVar10 = pSVar13->mapofs;
      bVar1 = pSVar13->nent;
      for (ref = 0; ref < bVar1; ref = ref + 1) {
        uVar11 = pSVar7[(ulong)uVar10 + (ulong)ref] & 0xffff;
        if (0x7fff < uVar11) {
          pIVar12 = (J->cur).ir;
          *(byte *)((long)pIVar12 + (ulong)uVar11 * 8 + 4) =
               *(byte *)((long)pIVar12 + (ulong)uVar11 * 8 + 4) & 0xdf;
        }
      }
    }
  }
  BVar4 = J->baseslot;
  BVar5 = J->maxslot;
  nslots = 1;
  do {
    if (BVar4 + BVar5 <= nslots) {
      while (bVar8) {
        bVar8 = false;
        for (nslots = 0; nslots < (uint)passx; nslots = nslots + 1) {
          if ((((&((J->cur).ir)->field_1)[(uint)phi[nslots]].t.irt & 0x20) == 0) &&
             (pIVar12 = (J->cur).ir, uVar2 = subst[(uint)phi[nslots]],
             ((&pIVar12->field_1)[uVar2].t.irt & 0x20) != 0)) {
            (&pIVar12->field_1)[uVar2].t.irt = (&pIVar12->field_1)[uVar2].t.irt & 0xdf;
            bVar8 = true;
          }
        }
      }
      for (nslots = 0; nslots < (uint)passx; nslots = nslots + 1) {
        uVar2 = phi[nslots];
        uVar10 = (uint)uVar2;
        pIVar12 = (J->cur).ir;
        if (((&pIVar12->field_1)[uVar10].t.irt & 0x20) == 0) {
          uVar3 = subst[uVar10];
          uVar11 = (uint)uVar3;
          if (uVar9 < uVar11) {
            pIVar6 = (J->cur).ir;
            *(byte *)((long)pIVar6 + (ulong)uVar11 * 8 + 4) =
                 *(byte *)((long)pIVar6 + (ulong)uVar11 * 8 + 4) | 0x40;
          }
          (J->fold).ins.field_0.ot = (&pIVar12->field_1)[uVar10].t.irt & 0x1f | 0x1300;
          (J->fold).ins.field_0.op1 = uVar2;
          (J->fold).ins.field_0.op2 = uVar3;
          lj_ir_emit(J);
        }
        else {
          (&pIVar12->field_1)[uVar10].t.irt = (&pIVar12->field_1)[uVar10].t.irt & 0xdf;
          (&pIVar12->field_1)[uVar10].t.irt = (&pIVar12->field_1)[uVar10].t.irt & 0xbf;
        }
      }
      return;
    }
    ir_1._0_4_ = J->slot[nslots] & 0xffff;
    while( true ) {
      bVar17 = false;
      if (0x7fff < (uint)ir_1) {
        bVar17 = (uint)ir_1 != subst[(uint)ir_1];
      }
      if (!bVar17) break;
      pIVar12 = (J->cur).ir;
      (&pIVar12->field_1)[(uint)ir_1].t.irt = (&pIVar12->field_1)[(uint)ir_1].t.irt & 0xdf;
      if ((((&pIVar12->field_1)[(uint)ir_1].t.irt & 0x40) != 0) ||
         (((&pIVar12->field_1)[(uint)ir_1].t.irt & 0x1f) < 3)) break;
      (&pIVar12->field_1)[(uint)ir_1].t.irt = (&pIVar12->field_1)[(uint)ir_1].t.irt | 0x40;
      if (0x3f < (uint)passx) {
        lj_trace_err(J,LJ_TRERR_PHIOV);
      }
      iVar16 = passx + 1;
      phi[(uint)passx] = (IRRef1)(uint)ir_1;
      ir_1._0_4_ = (uint)subst[(uint)ir_1];
      passx = iVar16;
      if (uVar9 < (uint)ir_1) break;
    }
    nslots = nslots + 1;
  } while( true );
}

Assistant:

static void loop_emit_phi(jit_State *J, IRRef1 *subst, IRRef1 *phi, IRRef nphi,
			  SnapNo onsnap)
{
  int passx = 0;
  IRRef i, j, nslots;
  IRRef invar = J->chain[IR_LOOP];
  /* Pass #1: mark redundant and potentially redundant PHIs. */
  for (i = 0, j = 0; i < nphi; i++) {
    IRRef lref = phi[i];
    IRRef rref = subst[lref];
    if (lref == rref || rref == REF_DROP) {  /* Invariants are redundant. */
      irt_clearphi(IR(lref)->t);
    } else {
      phi[j++] = (IRRef1)lref;
      if (!(IR(rref)->op1 == lref || IR(rref)->op2 == lref)) {
	/* Quick check for simple recurrences failed, need pass2. */
	irt_setmark(IR(lref)->t);
	passx = 1;
      }
    }
  }
  nphi = j;
  /* Pass #2: traverse variant part and clear marks of non-redundant PHIs. */
  if (passx) {
    SnapNo s;
    for (i = J->cur.nins-1; i > invar; i--) {
      IRIns *ir = IR(i);
      if (!irref_isk(ir->op2)) irt_clearmark(IR(ir->op2)->t);
      if (!irref_isk(ir->op1)) {
	irt_clearmark(IR(ir->op1)->t);
	if (ir->op1 < invar &&
	    ir->o >= IR_CALLN && ir->o <= IR_CARG) {  /* ORDER IR */
	  ir = IR(ir->op1);
	  while (ir->o == IR_CARG) {
	    if (!irref_isk(ir->op2)) irt_clearmark(IR(ir->op2)->t);
	    if (irref_isk(ir->op1)) break;
	    ir = IR(ir->op1);
	    irt_clearmark(ir->t);
	  }
	}
      }
    }
    for (s = J->cur.nsnap-1; s >= onsnap; s--) {
      SnapShot *snap = &J->cur.snap[s];
      SnapEntry *map = &J->cur.snapmap[snap->mapofs];
      MSize n, nent = snap->nent;
      for (n = 0; n < nent; n++) {
	IRRef ref = snap_ref(map[n]);
	if (!irref_isk(ref)) irt_clearmark(IR(ref)->t);
      }
    }
  }
  /* Pass #3: add PHIs for variant slots without a corresponding SLOAD. */
  nslots = J->baseslot+J->maxslot;
  for (i = 1; i < nslots; i++) {
    IRRef ref = tref_ref(J->slot[i]);
    while (!irref_isk(ref) && ref != subst[ref]) {
      IRIns *ir = IR(ref);
      irt_clearmark(ir->t);  /* Unmark potential uses, too. */
      if (irt_isphi(ir->t) || irt_ispri(ir->t))
	break;
      irt_setphi(ir->t);
      if (nphi >= LJ_MAX_PHI)
	lj_trace_err(J, LJ_TRERR_PHIOV);
      phi[nphi++] = (IRRef1)ref;
      ref = subst[ref];
      if (ref > invar)
	break;
    }
  }
  /* Pass #4: propagate non-redundant PHIs. */
  while (passx) {
    passx = 0;
    for (i = 0; i < nphi; i++) {
      IRRef lref = phi[i];
      IRIns *ir = IR(lref);
      if (!irt_ismarked(ir->t)) {  /* Propagate only from unmarked PHIs. */
	IRIns *irr = IR(subst[lref]);
	if (irt_ismarked(irr->t)) {  /* Right ref points to other PHI? */
	  irt_clearmark(irr->t);  /* Mark that PHI as non-redundant. */
	  passx = 1;  /* Retry. */
	}
      }
    }
  }
  /* Pass #5: emit PHI instructions or eliminate PHIs. */
  for (i = 0; i < nphi; i++) {
    IRRef lref = phi[i];
    IRIns *ir = IR(lref);
    if (!irt_ismarked(ir->t)) {  /* Emit PHI if not marked. */
      IRRef rref = subst[lref];
      if (rref > invar)
	irt_setphi(IR(rref)->t);
      emitir_raw(IRT(IR_PHI, irt_type(ir->t)), lref, rref);
    } else {  /* Otherwise eliminate PHI. */
      irt_clearmark(ir->t);
      irt_clearphi(ir->t);
    }
  }
}